

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_ref_test.cc
# Opt level: O0

void __thiscall
lf::refinement::test::RefineTest_TriaRef_Test::~RefineTest_TriaRef_Test
          (RefineTest_TriaRef_Test *this)

{
  RefineTest_TriaRef_Test *this_local;
  
  ~RefineTest_TriaRef_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RefineTest, TriaRef) {
  // Reference coordinate of triangle corners
  const Eigen::Matrix<double, 2, 3> ref_tria_corners(
      lf::base::RefEl::kTria().NodeCoords());
  // Create a triangle
  Eigen::Matrix<double, 2, 3> tria_coords;
  tria_coords.col(0) = Eigen::Vector2d({1, 1});
  tria_coords.col(1) = Eigen::Vector2d({3, -1});
  tria_coords.col(2) = Eigen::Vector2d({3, 3});
  std::unique_ptr<lf::geometry::TriaO1> tria_geo_ptr =
      std::make_unique<lf::geometry::TriaO1>(tria_coords);

  EXPECT_TRUE(tria_geo_ptr);
  std::cout << "Parent triangle " << std::endl
            << tria_geo_ptr->Global(ref_tria_corners) << std::endl;

  // Check the various refinements
  Hybrid2DRefinementPattern rp_copy(lf::base::RefEl::kTria(), RefPat::rp_copy);
  std::cout << "***** rp_copy(0) : child " << std::endl
            << (tria_geo_ptr->ChildGeometry(rp_copy, 0)) << std::endl;
  // Bisection refinement
  for (int anchor = 0; anchor < 3; anchor++) {
    Hybrid2DRefinementPattern rp_bisect(lf::base::RefEl::kTria(),
                                        RefPat::rp_bisect, anchor);
    std::cout << "*** rp_bisect(" << anchor << ") child "
              << (tria_geo_ptr->ChildGeometry(rp_bisect, 0)) << std::endl;
  }
  // Trisection refinement
  for (int anchor = 0; anchor < 3; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(), RefPat::rp_trisect,
                                 anchor);
    std::cout << "*** rp_trisect(anchor = " << anchor << ") : children "
              << std::endl
              << (tria_geo_ptr->ChildGeometry(rp, 0)) << std::endl;
    rp.setRefPattern(RefPat::rp_trisect_left).setAnchor(anchor);
    std::cout << "*** rp_trisect_left(anchor = " << anchor << ") : children "
              << std::endl
              << (tria_geo_ptr->ChildGeometry(rp, 0)) << std::endl;
  }
  // Splitting into four triangles
  for (int anchor = 0; anchor < 3; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(), RefPat::rp_quadsect,
                                 anchor);
    std::cout << "*** rp_quadsect(anchor = " << anchor << ") : children "
              << std::endl
              << (tria_geo_ptr->ChildGeometry(rp, 0)) << std::endl;
  }
  // Regular refinement
  Hybrid2DRefinementPattern rp_regular(lf::base::RefEl::kTria(),
                                       RefPat::rp_regular);
  std::cout << "*** rp_regular: children " << std::endl
            << (tria_geo_ptr->ChildGeometry(rp_regular, 0)) << std::endl;
  // Bayrcentric refinement
  Hybrid2DRefinementPattern rp_barycentric(lf::base::RefEl::kTria(),
                                           RefPat::rp_barycentric);
  std::cout << "*** rp_baryccentric, children " << std::endl
            << (tria_geo_ptr->ChildGeometry(rp_barycentric, 0)) << std::endl;
}